

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImU32 id_00;
  value_type_conflict3 *pvVar1;
  int local_38;
  ImGuiID id;
  int r_rel [4];
  ImGuiID seed;
  ImRect *r_abs_local;
  ImGuiWindow *this_local;
  
  pvVar1 = ImVector<unsigned_int>::back(&this->IDStack);
  local_38 = (int)((r_abs->Min).x - (this->Pos).x);
  id = (ImGuiID)((r_abs->Min).y - (this->Pos).y);
  r_rel[0] = (int)((r_abs->Max).x - (this->Pos).x);
  r_rel[1] = (int)((r_abs->Max).y - (this->Pos).y);
  id_00 = ImHash(&local_38,0x10,*pvVar1);
  ImGui::KeepAliveID(id_00);
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    const int r_rel[4] = { (int)(r_abs.Min.x - Pos.x), (int)(r_abs.Min.y - Pos.y), (int)(r_abs.Max.x - Pos.x), (int)(r_abs.Max.y - Pos.y) };
    ImGuiID id = ImHash(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}